

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inc_densities.c
# Opt level: O0

int inc_densities(float32 ***new_mixw,vector_t ***new_mean,vector_t ***new_var,
                 vector_t ****new_fullvar,float32 ***mixw,vector_t ***mean,vector_t ***var,
                 vector_t ****fullvar,float32 ***dnom,uint32 n_mixw,uint32 n_mgau,uint32 n_dnom,
                 uint32 n_feat,uint32 n_density,uint32 *veclen,uint32 n_inc)

{
  int iVar1;
  void *pvVar2;
  double dVar3;
  float local_64;
  uint32 local_60;
  float32 std;
  uint32 max_wt_idx;
  float32 max_wt;
  uint32 **did;
  uint local_48;
  uint32 r;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  vector_t ***mean_local;
  float32 ***mixw_local;
  vector_t ****new_fullvar_local;
  vector_t ***new_var_local;
  vector_t ***new_mean_local;
  float32 ***new_mixw_local;
  
  if (n_mixw < n_mgau) {
    __assert_fail("n_mgau <= n_mixw",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
                  ,0x60,
                  "int inc_densities(float32 ***, vector_t ***, vector_t ***, vector_t ****, float32 ***, vector_t ***, vector_t ***, vector_t ****, float32 ***, uint32, uint32, uint32, uint32, uint32, const uint32 *, uint32)"
                 );
  }
  if (n_mgau < n_mixw) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
            ,99,"Splitting of the tied mixture gaussians is not yet implemented\n");
    exit(1);
  }
  for (k = 0; k < n_mgau; k = k + 1) {
    for (l = 0; l < n_feat; l = l + 1) {
      for (r = 0; r < n_density; r = r + 1) {
        memcpy(new_mean[k][l][r],mean[k][l][r],(ulong)veclen[l] << 2);
        if (fullvar == (vector_t ****)0x0) {
          memcpy(new_var[k][l][r],var[k][l][r],(ulong)veclen[l] << 2);
        }
        else {
          memcpy(*new_fullvar[k][l][r],*fullvar[k][l][r],(ulong)(veclen[l] * veclen[l]) << 2);
        }
        new_mixw[k][l][r] = mixw[k][l][r];
      }
    }
  }
  pvVar2 = __ckd_calloc_2d__((ulong)n_feat,(ulong)n_inc,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
                             ,0x80);
  for (k = 0; k < n_mgau; k = k + 1) {
    printf("%u:",(ulong)k);
    fflush(_stdout);
    for (did._4_4_ = 0; did._4_4_ < n_inc; did._4_4_ = did._4_4_ + 1) {
      for (l = 0; l < n_feat; l = l + 1) {
        *(uint32 *)(*(long *)((long)pvVar2 + (ulong)l * 8) + (ulong)did._4_4_ * 4) = n_density;
        std = -1.0;
        local_60 = n_density;
        for (r = 0; r < n_density; r = r + 1) {
          if ((float)std < (float)dnom[k][l][r]) {
            iVar1 = not_done(r,*(uint32 **)((long)pvVar2 + (ulong)l * 8),did._4_4_);
            if (iVar1 != 0) {
              std = dnom[k][l][r];
              local_60 = r;
            }
          }
        }
        if (1.2e-38 < (float)dnom[k][l][local_60] || (float)dnom[k][l][local_60] == 1.2e-38) {
          new_mixw[k][l][local_60] = (float32)((float)new_mixw[k][l][local_60] / 2.0);
          new_mixw[k][l][n_density + did._4_4_] = new_mixw[k][l][local_60];
          if (fullvar == (vector_t ****)0x0) {
            memcpy(new_var[k][l][n_density + did._4_4_],var[k][l][local_60],(ulong)veclen[l] << 2);
          }
          else {
            memcpy(*new_fullvar[k][l][n_density + did._4_4_],*fullvar[k][l][local_60],
                   (ulong)(veclen[l] * veclen[l]) << 2);
          }
          for (local_48 = 0; local_48 < veclen[l]; local_48 = local_48 + 1) {
            if (fullvar == (vector_t ****)0x0) {
              dVar3 = sqrt((double)var[k][l][local_60][local_48]);
            }
            else {
              dVar3 = sqrt((double)fullvar[k][l][local_60][local_48][local_48]);
            }
            local_64 = (float)dVar3;
            new_mean[k][l][local_60][local_48] = local_64 * 0.2 + mean[k][l][local_60][local_48];
            new_mean[k][l][n_density + did._4_4_][local_48] =
                 local_64 * -0.2 + mean[k][l][local_60][local_48];
          }
          *(uint32 *)(*(long *)((long)pvVar2 + (ulong)l * 8) + (ulong)did._4_4_ * 4) = local_60;
          printf("%u(%.2e)",(double)(float)std,
                 (ulong)*(uint *)(*(long *)((long)pvVar2 + (ulong)l * 8) + (ulong)did._4_4_ * 4));
          fflush(_stdout);
        }
        else {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
                  ,0x94,"(mgau= %u, feat= %u, density= %u) never observed skipping\n",(ulong)k,
                  (ulong)l,r);
          new_mixw[k][l][n_density + did._4_4_] = 0.0;
          if (fullvar == (vector_t ****)0x0) {
            memcpy(new_var[k][l][n_density + did._4_4_],*var[k][l],(ulong)veclen[l] << 2);
          }
          else {
            memcpy(*new_fullvar[k][l][n_density + did._4_4_],**fullvar[k][l],
                   (ulong)(veclen[l] * veclen[l]) << 2);
          }
          memcpy(new_mean[k][l][n_density + did._4_4_],*mean[k][l],(ulong)veclen[l] << 2);
        }
      }
    }
    printf("\n");
  }
  return 0;
}

Assistant:

int
inc_densities(float32 ***new_mixw,
	      vector_t ***new_mean,
	      vector_t ***new_var,
	      vector_t ****new_fullvar,

	      float32 ***mixw,
	      vector_t ***mean,
	      vector_t ***var,
	      vector_t ****fullvar,
	      float32 ***dnom,
	      
	      uint32 n_mixw,
	      uint32 n_mgau,
	      uint32 n_dnom,
	      uint32 n_feat,
	      uint32 n_density,
	      const uint32 *veclen,
	      uint32 n_inc)
{
    uint32 i, j, k, l, r;
    uint32 **did;
    float32 max_wt;
    uint32 max_wt_idx;
    float32 std;

    assert(n_mgau <= n_mixw);
    
    if (n_mgau < n_mixw) {
	E_FATAL("Splitting of the tied mixture gaussians is not yet implemented\n");
    }

    /* copy old parameters into new arrays */
    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		memcpy(new_mean[i][j][k], mean[i][j][k], veclen[j]*sizeof(float32));
		if (fullvar)
		    memcpy(new_fullvar[i][j][k][0], fullvar[i][j][k][0],
			   veclen[j]*veclen[j]*sizeof(float32));
		else
		    memcpy(new_var[i][j][k], var[i][j][k], veclen[j]*sizeof(float32));
		new_mixw[i][j][k] = mixw[i][j][k];
	    }
	}
    }

    /* Over all mixtures:
     * 	- Find the largest unsplit component density.
     *		- Split it into two components where the new component
     *			mixw_a = mixw_b = 1/2 mixw
     *			mean_a = mean + 0.2 std
     *			mean_b = mean - 0.2 std
     *			var_a = var_b = var
     *
     * New parameters are placed beginning at index n_density
     */

    did = (uint32 **)ckd_calloc_2d(n_feat, n_inc, sizeof(uint32));

    for (i = 0; i < n_mgau; i++) {
	printf("%u:", i);
	fflush(stdout);
	
	for (r = 0; r < n_inc; r++) {
	    for (j = 0; j < n_feat; j++) {
		did[j][r] = n_density;

		/* find the density w/ the largest EM count not yet split (i.e. most probable, most occurances) */
		for (k = 0, max_wt = -1.0, max_wt_idx = n_density; k < n_density; k++) {
		    if ((max_wt < dnom[i][j][k]) && not_done(k, did[j], r)) {
			max_wt = dnom[i][j][k];
			max_wt_idx = k;
		    }
		}

		if ( dnom[i][j][max_wt_idx] < MIN_IEEE_NORM_POS_FLOAT32 ) {
		    E_WARN("(mgau= %u, feat= %u, density= %u) never observed skipping\n",
			   i, j, k);

		    new_mixw[i][j][n_density+r] = 0;

		    if (fullvar)
			memcpy(new_fullvar[i][j][n_density+r][0], fullvar[i][j][0][0],
			       veclen[j]*veclen[j]*sizeof(float32));
		    else 
			memcpy(new_var[i][j][n_density+r], var[i][j][0],
			       veclen[j]*sizeof(float32));

		    memcpy(new_mean[i][j][n_density+r], mean[i][j][0],
			   veclen[j]*sizeof(float32));

		    continue;
		}

		/* mixing weight of prior and new densities == 1/2 prior mixing weight */
		new_mixw[i][j][max_wt_idx] /= 2;
		new_mixw[i][j][n_density+r] = new_mixw[i][j][max_wt_idx];

		/* Keep variance of new class same as old */
		if (fullvar)
		    memcpy(new_fullvar[i][j][n_density+r][0], fullvar[i][j][max_wt_idx][0],
			   veclen[j]*veclen[j]*sizeof(float32));
		else
		    memcpy(new_var[i][j][n_density+r], var[i][j][max_wt_idx],
			   veclen[j]*sizeof(float32));

		/* mean_a = mean + 0.2 std */
		/* mean_b = mean - 0.2 std */
		for (l = 0; l < veclen[j]; l++) {
		    /* Use the stddev of mean[l] itself for full covariances. */
		    if (fullvar)
			std = (float32)sqrt(fullvar[i][j][max_wt_idx][l][l]);
		    else
			std = (float32)sqrt(var[i][j][max_wt_idx][l]);
		    
		    new_mean[i][j][max_wt_idx][l] = mean[i][j][max_wt_idx][l] + 0.2f * std;
		    new_mean[i][j][n_density+r][l]  = mean[i][j][max_wt_idx][l] - 0.2f * std;
		}

		did[j][r] = max_wt_idx;
		printf("%u(%.2e)", did[j][r], max_wt);
		fflush(stdout);
	    }
	}
	printf("\n");
    }
	    

    return S3_SUCCESS;
}